

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void handle_splicing(token *word)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = word->data_size;
  if (uVar1 != 0) {
    uVar5 = uVar1 - 1;
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = 2;
      do {
        if ((word->data[uVar3 - 2] == '\\') && (uVar4 = uVar3, word->data[uVar3 - 1] == '\n'))
        break;
        bVar7 = uVar3 != uVar1;
        uVar4 = uVar5;
        uVar3 = uVar3 + 1;
      } while (bVar7);
    }
    if (uVar4 != uVar5) {
      lVar6 = uVar4 - 2;
      while (uVar4 < word->data_size - 1) {
        pcVar2 = word->data;
        if ((pcVar2[uVar4] == '\\') && (pcVar2[uVar4 + 1] == '\n')) {
          uVar4 = uVar4 + 2;
        }
        else {
          pcVar2[lVar6] = pcVar2[uVar4];
          uVar4 = uVar4 + 1;
          lVar6 = lVar6 + 1;
        }
      }
      word->data[lVar6] = word->data[uVar4];
    }
  }
  return;
}

Assistant:

void handle_splicing(struct token *word)
{
	size_t back;
	size_t front;
	if(word->data_size==0)
		return;
	front=0;
	for(front;front<word->data_size-1;++front)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
			break;
		}
	}
	if(front==word->data_size-1)
		return;

	for(back=front-2;front<word->data_size-1;)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
		}else
		{
			word->data[back]=word->data[front];
			++front;
			++back;
		}
	}
	word->data[back]=word->data[front];
}